

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.capnp.h
# Opt level: O0

Builder * __thiscall
capnp::rpc::Return::Builder::initException(Builder *__return_storage_ptr__,Builder *this)

{
  uint uVar1;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  uVar1 = bounded<3u>();
  capnp::_::StructBuilder::setDataField<capnp::rpc::Return::Which>(&this->_builder,uVar1,EXCEPTION);
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::getPointerField(&local_28,&this->_builder,uVar1);
  capnp::_::PointerHelpers<capnp::rpc::Exception,_(capnp::Kind)3>::init
            ((EVP_PKEY_CTX *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::rpc::Exception::Builder Return::Builder::initException() {
  _builder.setDataField<Return::Which>(
      ::capnp::bounded<3>() * ::capnp::ELEMENTS, Return::EXCEPTION);
  return ::capnp::_::PointerHelpers< ::capnp::rpc::Exception>::init(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS));
}